

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

void coda_get_stringset(char *str,
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *result)

{
  char *pcVar1;
  ulong uVar2;
  char *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  string temp_1;
  string temp;
  char *i;
  char *begin;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  allocator local_89;
  string local_88 [32];
  _Base_ptr local_68;
  undefined1 local_60;
  allocator local_41;
  string local_40 [32];
  char *local_20;
  char *local_18;
  
  if ((in_RDI != (char *)0x0) && (local_18 = in_RDI, *in_RDI != '\0')) {
    while (local_18 != (char *)0x0) {
      local_20 = local_18;
      local_20 = strchr(local_18,0x2c);
      pcVar1 = local_18;
      if (local_20 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_88,pcVar1,&local_89);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff40._M_node,
                 (value_type *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
        std::__cxx11::string::~string(local_88);
      }
      else {
        uVar2 = (long)local_20 - (long)local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_40,pcVar1,uVar2,&local_41);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
        pVar3 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffff40._M_node,
                         (value_type *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38)
                        );
        in_stack_ffffffffffffff40 = pVar3.first._M_node;
        in_stack_ffffffffffffff3f = pVar3.second;
        local_20 = local_20 + 1;
        local_68 = in_stack_ffffffffffffff40._M_node;
        local_60 = in_stack_ffffffffffffff3f;
        std::__cxx11::string::~string(local_40);
      }
      local_18 = local_20;
    }
  }
  return;
}

Assistant:

void coda_get_stringset(const char* str, std::set<std::string>& result)
{
	if (!str || !*str)
	{
		return;
	}

	const char* begin = str;
	const char* i = str;
	while (i)
	{
		i = strchr(i, ',');
		if (i)
		{
			std::string temp(begin, i - begin);
			result.insert(temp);
			++i;
		}
		else
		{
			std::string temp(begin);
			result.insert(temp);
		}
		begin = i;
	}
}